

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

Function * __thiscall
spvtools::opt::PrivateToLocalPass::FindLocalFunction(PrivateToLocalPass *this,Instruction *inst)

{
  uint32_t id;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_24_3_10abada0 local_60;
  function<void_(spvtools::opt::Instruction_*)> local_48;
  Function *local_28;
  Function *target_function;
  Instruction *pIStack_18;
  bool found_first_use;
  Instruction *inst_local;
  PrivateToLocalPass *this_local;
  
  target_function._7_1_ = 0;
  local_28 = (Function *)0x0;
  pIStack_18 = inst;
  inst_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  id = Instruction::result_id(pIStack_18);
  local_60.target_function = &local_28;
  local_60.found_first_use = (bool *)((long)&target_function + 7);
  local_60.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::PrivateToLocalPass::FindLocalFunction(spvtools::opt::Instruction_const&)const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_48,&local_60);
  analysis::DefUseManager::ForEachUser(this_01,id,&local_48);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_48);
  return local_28;
}

Assistant:

Function* PrivateToLocalPass::FindLocalFunction(const Instruction& inst) const {
  bool found_first_use = false;
  Function* target_function = nullptr;
  context()->get_def_use_mgr()->ForEachUser(
      inst.result_id(),
      [&target_function, &found_first_use, this](Instruction* use) {
        BasicBlock* current_block = context()->get_instr_block(use);
        if (current_block == nullptr) {
          return;
        }

        if (!IsValidUse(use)) {
          found_first_use = true;
          target_function = nullptr;
          return;
        }
        Function* current_function = current_block->GetParent();
        if (!found_first_use) {
          found_first_use = true;
          target_function = current_function;
        } else if (target_function != current_function) {
          target_function = nullptr;
        }
      });
  return target_function;
}